

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_finish_decode
               (uchar *cbuffer,size_t cbufsize,uint w,uint h,LodePNGState *state,void *idat_in,
               size_t idatsize_in)

{
  int iVar1;
  uint uVar2;
  LodePNGState *pLVar3;
  LodePNGState *in_RSI;
  long in_RDI;
  long in_R8;
  LodePNGColorMode *in_R9;
  uchar *unaff_retaddr;
  uchar **in_stack_00000008;
  uchar *tbuf;
  size_t outsize;
  uint in_stack_00000098;
  uint in_stack_0000009c;
  LodePNGColorMode *in_stack_000000a0;
  LodePNGColorMode *in_stack_000000a8;
  uchar *in_stack_000000b0;
  uchar *in_stack_000000b8;
  LodePNGColorMode *in_stack_ffffffffffffffa8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDI == 0) || (in_RSI == (LodePNGState *)0x0)) {
    *(undefined4 *)(in_R8 + 0x278) = 0x69;
    return 0x69;
  }
  if ((*(int *)(in_R8 + 0x34) == 0) ||
     (iVar1 = lodepng_color_mode_equal
                        ((LodePNGColorMode *)(in_R8 + 0xa8),(LodePNGColorMode *)(in_R8 + 0xe0)),
     iVar1 != 0)) {
    if (*(int *)(in_R8 + 0x34) == 0) {
      uVar2 = lodepng_color_mode_copy(in_stack_ffffffffffffffa8,(LodePNGColorMode *)0x34f2f2);
      *(uint *)(in_R8 + 0x278) = uVar2;
      if (*(int *)(in_R8 + 0x278) != 0) {
        return *(uint *)(in_R8 + 0x278);
      }
    }
    uVar2 = inflateIdat(in_stack_00000008,unaff_retaddr,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI,in_RSI,(void *)outsize,
                        (size_t)idat_in);
    *(uint *)(in_R8 + 0x278) = uVar2;
  }
  else {
    uVar2 = inflateIdat(in_stack_00000008,unaff_retaddr,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI,in_RSI,(void *)outsize,
                        (size_t)idat_in);
    *(uint *)(in_R8 + 0x278) = uVar2;
    if (((*(int *)(in_R8 + 0xa8) != 2) && (*(int *)(in_R8 + 0xa8) != 6)) &&
       (*(int *)(in_R8 + 0xac) != 8)) {
      return 0x38;
    }
    pLVar3 = (LodePNGState *)
             lodepng_get_raw_size
                       ((uint)((ulong)in_stack_00000008 >> 0x20),(uint)in_stack_00000008,in_R9);
    if (in_RSI < pLVar3) {
      *(undefined4 *)(in_R8 + 0x278) = 0x7b;
      return 0x7b;
    }
    uVar2 = lodepng_convert(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                            in_stack_0000009c,in_stack_00000098);
    *(uint *)(in_R8 + 0x278) = uVar2;
    lodepng_free((void *)0x34f46a);
  }
  return *(uint *)(in_R8 + 0x278);
}

Assistant:

unsigned lodepng_finish_decode(unsigned char* cbuffer, size_t cbufsize,
                               unsigned w, unsigned h,
                               LodePNGState* state, void* idat_in, size_t idatsize_in)
{
  if (!cbuffer || cbufsize == 0)
      CERROR_RETURN_ERROR(state->error, 105);  /*no destination specified*/

  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
    state->error = inflateIdat(NULL, cbuffer, cbufsize, w, h, state, idat_in, idatsize_in);
  } else {
    size_t outsize;
    unsigned char* tbuf;

    /*color conversion needed. Have lodepng_inflate_idat create a temporary buffer for the unconverted data*/
    state->error = inflateIdat(&tbuf, NULL, 0, w, h, state, idat_in, idatsize_in);
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
      && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }
    outsize = lodepng_get_raw_size(w, h, &state->info_raw);
    if(cbufsize < outsize) CERROR_RETURN_ERROR(state->error, 123); /* error: "destination buffer too small */
    state->error = lodepng_convert(cbuffer, tbuf, &state->info_raw,
                                   &state->info_png.color, w, h);
    lodepng_free(tbuf);
  }
  return state->error;
}